

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Node * __thiscall Parser::declaration(Parser *this)

{
  Node *operand1;
  Node *this_00;
  allocator local_51;
  string local_50;
  string local_30;
  
  Lexer::next_token(this->lex);
  eat_abi_cxx11_(&local_30,this,MUT);
  std::__cxx11::string::~string((string *)&local_30);
  Lexer::next_token(this->lex);
  operand1 = set(this);
  this_00 = (Node *)operator_new(0x48);
  std::__cxx11::string::string((string *)&local_50,"",&local_51);
  Node::Node(this_00,DCLRT,operand1,(Node *)0x0,&local_50,(Node *)0x0,(Node *)0x0);
  std::__cxx11::string::~string((string *)&local_50);
  return this_00;
}

Assistant:

Node* Parser::declaration() // ������� ������� ����������
{
	lex->next_token();
	eat(token_type::MUT);
	lex->next_token();

	Node* set_node = set();

	Node* declaration_node = new Node(node_type::DCLRT, set_node);
	return declaration_node;
}